

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.hxx
# Opt level: O1

const_iterator * __thiscall
cmsys::
_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
::operator++(_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
             *this)

{
  _Node *p_Var1;
  _Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var2;
  _Hashtable *p_Var3;
  pointer pp_Var4;
  pointer pp_Var5;
  ulong uVar6;
  char *pcVar7;
  char cVar8;
  
  p_Var1 = this->_M_cur;
  p_Var2 = p_Var1->_M_next;
  this->_M_cur = p_Var2;
  if (p_Var2 == (_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    pcVar7 = (p_Var1->_M_val)._M_dataplus._M_p;
    cVar8 = *pcVar7;
    if (cVar8 == '\0') {
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      do {
        pcVar7 = pcVar7 + 1;
        uVar6 = (long)cVar8 + uVar6 * 5;
        cVar8 = *pcVar7;
      } while (cVar8 != '\0');
    }
    if (this->_M_cur == (_Node *)0x0) {
      p_Var3 = this->_M_ht;
      pp_Var4 = (p_Var3->_M_buckets).
                super__Vector_base<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = uVar6 % (ulong)((long)(p_Var3->_M_buckets).
                                    super__Vector_base<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var4 >> 3)
      ;
      pp_Var5 = (p_Var3->_M_buckets).
                super__Vector_base<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      do {
        uVar6 = uVar6 + 1;
        if ((ulong)((long)pp_Var5 - (long)pp_Var4 >> 3) <= uVar6) {
          return this;
        }
        p_Var2 = pp_Var4[uVar6];
        this->_M_cur = p_Var2;
      } while (p_Var2 == (_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x0);
    }
  }
  return this;
}

Assistant:

_Hashtable_const_iterator<_Val,_Key,_HF,_ExK,_EqK,_All>&
_Hashtable_const_iterator<_Val,_Key,_HF,_ExK,_EqK,_All>::operator++()
{
  const _Node* __old = _M_cur;
  _M_cur = _M_cur->_M_next;
  if (!_M_cur) {
    size_type __bucket = _M_ht->_M_bkt_num(__old->_M_val);
    while (!_M_cur && ++__bucket < _M_ht->_M_buckets.size())
      _M_cur = _M_ht->_M_buckets[__bucket];
  }
  return *this;
}